

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O1

DdNode * Cudd_addDivide(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  
  pDVar1 = *f;
  pDVar2 = dd->zero;
  if (pDVar1 != pDVar2) {
    pDVar2 = *g;
    if (pDVar2 == dd->one) {
      return pDVar1;
    }
    if ((pDVar1->index == 0x7fffffff) && (pDVar2->index == 0x7fffffff)) {
      pDVar1 = cuddUniqueConst(dd,(pDVar1->type).value / (pDVar2->type).value);
      return pDVar1;
    }
    pDVar2 = (DdNode *)0x0;
  }
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addDivide(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *res;
    DdNode *F, *G;
    CUDD_VALUE_TYPE value;

    F = *f; G = *g;
    /* We would like to use F == G -> F/G == 1, but F and G may
    ** contain zeroes. */
    if (F == DD_ZERO(dd)) return(DD_ZERO(dd));
    if (G == DD_ONE(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        value = cuddV(F)/cuddV(G);
        res = cuddUniqueConst(dd,value);
        return(res);
    }
    return(NULL);

}